

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

void do_exchange(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  long lVar5;
  CHAR_DATA *in_RDI;
  float fVar6;
  float chance;
  int AC;
  CHAR_DATA *victim;
  int in_stack_00000084;
  bool in_stack_0000008b;
  int in_stack_0000008c;
  CHAR_DATA *in_stack_00000090;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  int in_stack_000000bc;
  bool in_stack_000000c2;
  bool in_stack_000000c3;
  int in_stack_000000c4;
  CHAR_DATA *in_stack_000000c8;
  CHAR_DATA *in_stack_000000d0;
  int in_stack_000000f0;
  char *in_stack_000000f8;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  void *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char_data *in_stack_ffffffffffffffc0;
  char_data *local_38;
  
  iVar3 = get_skill(in_stack_000000b0,in_stack_000000ac);
  fVar6 = (float)iVar3;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    sVar1 = in_RDI->level;
    lVar5 = (long)gsn_exchange;
    this = char_data::Class(in_stack_ffffffffffffffc0);
    iVar4 = CClass::GetIndex(this);
    if ((*(short *)(lVar5 * 0x60 + 0x8daef8 + (long)iVar4 * 2) <= sVar1) ||
       (bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
       bVar2)) {
      if (in_RDI->fighting == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffffc0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        return;
      }
      bVar2 = is_wielded((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                         (int)in_stack_ffffffffffffffb0);
      if (((bVar2) ||
          (bVar2 = is_wielded((CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                              (int)in_stack_ffffffffffffffb0), bVar2)) ||
         (bVar2 = is_wielded((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                             (int)in_stack_ffffffffffffffb0), bVar2)) {
        send_to_char((char *)in_stack_ffffffffffffffc0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        return;
      }
      if (in_RDI->fighting == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffffc0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        return;
      }
      if (in_RDI->fighting == in_RDI) {
        send_to_char((char *)in_stack_ffffffffffffffc0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        return;
      }
      if (30.0 <= fVar6 * 0.9) {
        if (fVar6 * 0.9 <= 90.0) {
          in_stack_ffffffffffffffc0 = (char_data *)((double)iVar3 * 0.9);
          local_38 = in_stack_ffffffffffffffc0;
        }
        else {
          in_stack_ffffffffffffffc0 = (char_data *)0x4056800000000000;
          local_38 = in_stack_ffffffffffffffc0;
        }
      }
      else {
        local_38 = (char_data *)0x403e000000000000;
      }
      average_ac(in_RDI);
      act((char *)in_stack_ffffffffffffffc0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
          in_stack_ffffffffffffffb0,
          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      act((char *)in_stack_ffffffffffffffc0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
          in_stack_ffffffffffffffb0,
          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      act((char *)in_stack_ffffffffffffffc0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
          in_stack_ffffffffffffffb0,
          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      one_hit_new(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c3,
                  in_stack_000000c2,in_stack_000000bc,in_stack_000000f0,in_stack_000000f8);
      iVar3 = number_percent();
      if ((float)(double)local_38 <= (float)iVar3) {
        one_hit_new(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c3,
                    in_stack_000000c2,in_stack_000000bc,in_stack_000000f0,in_stack_000000f8);
        check_improve(in_stack_00000090,in_stack_0000008c,in_stack_0000008b,in_stack_00000084);
      }
      else {
        one_hit_new(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c3,
                    in_stack_000000c2,in_stack_000000bc,in_stack_000000f0,in_stack_000000f8);
        check_improve(in_stack_00000090,in_stack_0000008c,in_stack_0000008b,in_stack_00000084);
      }
      WAIT_STATE(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffffc0,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

void do_exchange(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int AC;
	float chance = get_skill(ch, gsn_exchange);

	if ((chance == 0) || (ch->level < skill_table[gsn_exchange].skill_level[ch->Class()->GetIndex()] && !is_npc(ch)))
	{
		send_to_char("You don't know how to do that.\n\r", ch);
		return;
	}

	if (!ch->fighting)
	{
		send_to_char("You must be fighting to exchange blows!\n\r", ch);
		return;
	}

	if (is_wielded(ch, WEAPON_SPEAR, WIELD_PRIMARY)
		|| is_wielded(ch, WEAPON_STAFF, WIELD_PRIMARY)
		|| is_wielded(ch, WEAPON_POLEARM, WIELD_PRIMARY))
	{
		send_to_char("Your weapon is ineffective in close quarters.", ch);
		return;
	}

	victim = ch->fighting;

	if (victim == nullptr)
	{
		send_to_char("Who are you trying to exchange blows with?\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You really don't want to hit yourself.\n\r", ch);
		return;
	}

	chance = URANGE(30, chance * .9, 90);
	AC = average_ac(ch) / 5;

	if (AC > 50)
		AC = 50;

	AC = 100 - AC;

	act("Ignoring $N's onslaught, you close the ground between you and strike!", ch, 0, victim, TO_CHAR);
	act("Ignoring your onslaught, $n closes the ground between you and strikes!", ch, 0, victim, TO_VICT);
	act("Ignoring $N's onslaught, $n closes the ground between them and strikes!", ch, 0, victim, TO_NOTVICT);

	one_hit_new(victim, ch, TYPE_UNDEFINED, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, AC, nullptr);

	if (number_percent() < chance)
	{
		one_hit_new(ch, victim, TYPE_UNDEFINED, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 200, nullptr);
		check_improve(ch, gsn_exchange, true, 1);
	}
	else
	{
		one_hit_new(ch, victim, TYPE_UNDEFINED, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 0, nullptr);
		check_improve(ch, gsn_exchange, false, 1);
	}

	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
}